

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

uint32_t __thiscall
cfd::core::ConfidentialTransaction::AddTxOut
          (ConfidentialTransaction *this,Amount *value,ConfidentialAssetId *asset,
          Script *locking_script)

{
  uint32_t uVar1;
  ByteData local_90;
  ByteData local_68;
  ConfidentialNonce local_50;
  Script *local_28;
  Script *locking_script_local;
  ConfidentialAssetId *asset_local;
  Amount *value_local;
  ConfidentialTransaction *this_local;
  
  local_28 = locking_script;
  locking_script_local = (Script *)asset;
  asset_local = (ConfidentialAssetId *)value;
  value_local = (Amount *)this;
  ConfidentialNonce::ConfidentialNonce(&local_50);
  ByteData::ByteData(&local_68);
  ByteData::ByteData(&local_90);
  uVar1 = AddTxOut(this,value,asset,locking_script,&local_50,&local_68,&local_90);
  ByteData::~ByteData((ByteData *)0x4af823);
  ByteData::~ByteData((ByteData *)0x4af82c);
  ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x4af835);
  return uVar1;
}

Assistant:

uint32_t ConfidentialTransaction::AddTxOut(
    const Amount &value, const ConfidentialAssetId &asset,
    const Script &locking_script) {
  return AddTxOut(
      value, asset, locking_script, ConfidentialNonce(), ByteData(),
      ByteData());
}